

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests-records_calendar_dates.c
# Opt level: O1

void CGTFS_RecordCalendarDate(void)

{
  int iVar1;
  long lVar2;
  char *pcVar3;
  calendar_date_t *pcVar4;
  undefined4 *puVar5;
  byte bVar6;
  calendar_date_t cd_1;
  char *field_values [3];
  char *field_names [3];
  calendar_date_t cStack_f8;
  undefined1 local_a8 [16];
  char *local_98;
  undefined1 local_58 [16];
  char *local_48;
  
  bVar6 = 0;
  iVar1 = greatest_test_pre("calendar_date_read");
  if (iVar1 != 0) {
    iVar1 = _setjmp((__jmp_buf_tag *)greatest_info.jump_dest);
    if (iVar1 == 0) {
      local_48 = "exception_type";
      local_58._0_8_ = "service_id";
      local_58._8_8_ = "date";
      local_98 = "2";
      local_a8._0_8_ = "1000";
      local_a8._8_8_ = "20000101";
      read_calendar_date(&cStack_f8,3,(char **)local_58,(char **)local_a8);
      greatest_info.assertions = greatest_info.assertions + 1;
      iVar1 = greatest_do_assert_equal_t("1000",&cStack_f8,&greatest_type_info_string,(void *)0x0);
      if (iVar1 == 0) {
        greatest_info.fail_line = 0x14;
        if (greatest_type_info_string.equal == (greatest_equal_cb *)0x0) {
LAB_0011fecd:
          greatest_info.msg = "type_info->equal callback missing!";
        }
        else {
          greatest_info.msg = "\"1000\" != cd_1.service_id";
        }
      }
      else {
        greatest_info.assertions = greatest_info.assertions + 1;
        iVar1 = greatest_do_assert_equal_t
                          ("20000101",cStack_f8.date,&greatest_type_info_string,(void *)0x0);
        if (iVar1 == 0) {
          greatest_info.fail_line = 0x15;
          if (greatest_type_info_string.equal == (greatest_equal_cb *)0x0) goto LAB_0011fecd;
          greatest_info.msg = "\"20000101\" != cd_1.date";
        }
        else {
          greatest_info.assertions = greatest_info.assertions + 1;
          if (cStack_f8.exception_type == ET_REMOVED) {
            greatest_info.msg = (char *)0x0;
            iVar1 = 0;
            goto LAB_0011ff10;
          }
          greatest_info.fail_line = 0x16;
          greatest_info.msg = "ET_REMOVED != cd_1.exception_type";
        }
      }
      greatest_info.fail_file =
           "/workspace/llm4binary/github/license_all_cmakelists_1510/4rterius[P]cgtfs/tests/tests_records/tests-records_calendar_dates.c"
      ;
      iVar1 = -1;
      if ((greatest_info.flags & 4) != 0) goto LAB_0012005b;
    }
LAB_0011ff10:
    greatest_test_post(iVar1);
  }
  iVar1 = greatest_test_pre("calendar_date_compare");
  if (iVar1 == 0) {
    return;
  }
  iVar1 = _setjmp((__jmp_buf_tag *)greatest_info.jump_dest);
  if (iVar1 == 0) {
    pcVar3 = "SOME_ID1";
    pcVar4 = &cStack_f8;
    for (lVar2 = 0x14; lVar2 != 0; lVar2 = lVar2 + -1) {
      *(undefined4 *)pcVar4 = *(undefined4 *)pcVar3;
      pcVar3 = pcVar3 + ((ulong)bVar6 * -2 + 1) * 4;
      pcVar4 = (calendar_date_t *)((long)pcVar4 + ((ulong)bVar6 * -2 + 1) * 4);
    }
    pcVar3 = "SOME_ID1";
    pcVar4 = (calendar_date_t *)local_58;
    for (lVar2 = 0x14; lVar2 != 0; lVar2 = lVar2 + -1) {
      *(undefined4 *)pcVar4->service_id = *(undefined4 *)pcVar3;
      pcVar3 = pcVar3 + ((ulong)bVar6 * -2 + 1) * 4;
      pcVar4 = (calendar_date_t *)((long)pcVar4 + (ulong)bVar6 * -8 + 4);
    }
    pcVar3 = "SOME_ID2";
    puVar5 = (undefined4 *)local_a8;
    for (lVar2 = 0x14; lVar2 != 0; lVar2 = lVar2 + -1) {
      *puVar5 = *(undefined4 *)pcVar3;
      pcVar3 = pcVar3 + ((ulong)bVar6 * -2 + 1) * 4;
      puVar5 = puVar5 + (ulong)bVar6 * -2 + 1;
    }
    greatest_info.assertions = greatest_info.assertions + 1;
    iVar1 = equal_calendar_date(&cStack_f8,(calendar_date_t *)local_58);
    if (iVar1 == 1) {
      greatest_info.assertions = greatest_info.assertions + 1;
      iVar1 = equal_calendar_date(&cStack_f8,(calendar_date_t *)local_a8);
      if (iVar1 == 0) {
        greatest_info.assertions = greatest_info.assertions + 1;
        iVar1 = equal_calendar_date((calendar_date_t *)local_58,(calendar_date_t *)local_a8);
        if (iVar1 == 0) {
          greatest_info.msg = (char *)0x0;
          iVar1 = 0;
          goto LAB_00120001;
        }
        greatest_info.fail_line = 0x30;
        greatest_info.msg = "0 != equal_calendar_date(&b, &c)";
      }
      else {
        greatest_info.fail_line = 0x2f;
        greatest_info.msg = "0 != equal_calendar_date(&a, &c)";
      }
    }
    else {
      greatest_info.fail_line = 0x2e;
      greatest_info.msg = "1 != equal_calendar_date(&a, &b)";
    }
    greatest_info.fail_file =
         "/workspace/llm4binary/github/license_all_cmakelists_1510/4rterius[P]cgtfs/tests/tests_records/tests-records_calendar_dates.c"
    ;
    iVar1 = -1;
    if ((greatest_info.flags & 4) != 0) {
LAB_0012005b:
      greatest_info.fail_file =
           "/workspace/llm4binary/github/license_all_cmakelists_1510/4rterius[P]cgtfs/tests/tests_records/tests-records_calendar_dates.c"
      ;
      abort();
    }
  }
LAB_00120001:
  greatest_test_post(iVar1);
  return;
}

Assistant:

SUITE(CGTFS_RecordCalendarDate) {
    RUN_TEST(calendar_date_read);
    RUN_TEST(calendar_date_compare);
}